

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# threadpool.c
# Opt level: O1

void uv__threadpool_cleanup(void)

{
  int iVar1;
  long lVar2;
  ulong uVar3;
  
  if (nthreads != 0) {
    post(&exit_message,UV__WORK_CPU);
    if (nthreads != 0) {
      lVar2 = 0;
      uVar3 = 0;
      do {
        iVar1 = uv_thread_join((uv_thread_t *)((long)threads + lVar2));
        if (iVar1 != 0) {
          abort();
        }
        uVar3 = uVar3 + 1;
        lVar2 = lVar2 + 8;
      } while (uVar3 < nthreads);
    }
    if (threads != default_threads) {
      uv__free(threads);
    }
    uv_mutex_destroy(&mutex);
    uv_cond_destroy(&cond);
    threads = (uv_thread_t *)0x0;
    nthreads = 0;
  }
  return;
}

Assistant:

__attribute__((destructor))
#endif
void uv__threadpool_cleanup(void) {
  unsigned int i;

  if (nthreads == 0)
    return;

#ifndef __MVS__
  /* TODO(gabylb) - zos: revisit when Woz compiler is available. */
  post(&exit_message, UV__WORK_CPU);
#endif

  for (i = 0; i < nthreads; i++)
    if (uv_thread_join(threads + i))
      abort();

  if (threads != default_threads)
    uv__free(threads);

  uv_mutex_destroy(&mutex);
  uv_cond_destroy(&cond);

  threads = NULL;
  nthreads = 0;
}